

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall sfc::Map::save(Map *this,string *path,bool column_order,uint split_w,uint split_h)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  native_data((byte_vec_t *)&_Stack_28,this,column_order,split_w,split_h);
  write_file<unsigned_char>
            (path,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void Map::save(const std::string& path, bool column_order, unsigned split_w, unsigned split_h) const {
  sfc::write_file(path, native_data(column_order, split_w, split_h));
}